

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  bool skipHeader;
  allocator local_62;
  allocator local_61;
  string local_60;
  string local_40;
  
  progname = *argv;
  bVar1 = false;
  do {
    skipHeader = bVar1;
    iVar2 = getopt(argc,argv,"svh");
    bVar1 = true;
  } while (iVar2 == 0x73);
  if (iVar2 == -1) {
    std::__cxx11::string::string((string *)&local_40,"",&local_61);
    std::__cxx11::string::string((string *)&local_60,"",&local_62);
    initstreams(&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    quantiletocsv::doit(skipHeader);
    return 0;
  }
  if (iVar2 == 0x76) {
    fprintf(_stderr,"%s: version: %s\n",*argv,"");
  }
  else {
    help();
  }
  exit(1);
}

Assistant:

int main(int argc, char* argv[]) {

  progname = argv[0];
  int opt;
  bool skipHeader = false;

  while ((opt = getopt(argc, argv, "svh")) != -1) {

    switch (opt) {

      case 's':
	skipHeader = true;
	break;
      case 'v':
	fprintf(stderr, "%s: version: %s\n", argv[0], VERSION);
	exit(EXIT_FAILURE);
	break;
      case 'h':
      default:
	help();
	exit(EXIT_FAILURE);

    }

  }

  try {

    initstreams();
    quantiletocsv::doit(skipHeader);
    return EXIT_SUCCESS;

  } catch (std::bad_alloc&) {

    fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
    exit(EXIT_FAILURE);

  }

}